

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardsuperblockheader.h
# Opt level: O2

size_t __thiscall
Hoard::HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::BigHeap>::getSize
          (HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::BigHeap> *this,void *ptr)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->_objectSize;
  uVar2 = (long)ptr - (long)this->_start;
  if (this->_objectSizeIsPowerOfTwo == true) {
    uVar2 = uVar1 - 1 & uVar2;
  }
  else {
    uVar2 = uVar2 % uVar1;
  }
  return uVar1 - uVar2;
}

Assistant:

size_t getSize (void * ptr) const {
      assert (isValid());
      auto offset = (size_t) ptr - (size_t) _start;
      size_t newSize;
      if (_objectSizeIsPowerOfTwo) {
	newSize = _objectSize - (offset & (_objectSize - 1));
      } else {
	newSize = _objectSize - (offset % _objectSize);
      }
      return newSize;
    }